

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O3

cmDependInformation * __thiscall
anon_unknown.dwarf_10521be::cmLBDepend::GetDependInformation
          (cmLBDepend *this,string *file,string *extraPath)

{
  _Base_ptr *__k;
  _Rb_tree_header *__x;
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  default_delete<(anonymous_namespace)::cmDependInformation> *this_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _Rb_tree_header *p_Var7;
  bool bVar8;
  int iVar9;
  byte extraout_var;
  iterator iVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  iterator iVar14;
  cmDependInformation *__s;
  cmDependInformation *this_01;
  _Rb_tree_node_base *p_Var15;
  ulong uVar16;
  _Alloc_hider in_RCX;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  pointer pbVar19;
  pointer pcVar20;
  cmDependInformation *__ptr;
  DirectoryToFileToPathMapType *this_02;
  DependInformationMapType *this_03;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar21;
  string path;
  string fullPath;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  DependInformationMapType *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_02 = &this->DirectoryToFileToPathMap;
  iVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::find(&this_02->_M_t,extraPath);
  if (((_Rb_tree_header *)iVar10._M_node ==
       &(this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header) ||
     (iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(iVar10._M_node + 2,file),
     iVar11._M_node == (_Base_ptr)&iVar10._M_node[2]._M_parent)) {
    bVar8 = cmsys::SystemTools::FileExists(file,true);
    if (!bVar8) {
      pbVar19 = (this->IncludeDirectories).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (this->IncludeDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar19 != pbVar3) {
        paVar2 = &local_98.field_2;
        do {
          pcVar20 = (pbVar19->_M_dataplus)._M_p;
          local_98._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,pcVar20,pcVar20 + pbVar19->_M_string_length);
          if ((local_98._M_string_length != 0) &&
             (in_RCX._M_p = local_98._M_dataplus._M_p,
             local_98._M_dataplus._M_p[local_98._M_string_length - 1] != '/')) {
            std::__cxx11::string::append((char *)&local_98);
          }
          std::__cxx11::string::_M_append((char *)&local_98,(ulong)(file->_M_dataplus)._M_p);
          bVar8 = cmsys::SystemTools::FileExists(&local_98,true);
          if ((bVar8) && (bVar8 = cmsys::SystemTools::FileIsDirectory(&local_98), !bVar8)) {
            cmsys::SystemTools::CollapseFullPath((string *)&local_78,&local_98);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      ::operator[](this_02,extraPath);
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](pmVar12,file);
            std::__cxx11::string::_M_assign((string *)pmVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p == paVar2) goto LAB_0033a59a;
            goto LAB_0033a90d;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          pbVar19 = pbVar19 + 1;
        } while (pbVar19 != pbVar3);
      }
      if (extraPath->_M_string_length != 0) {
        paVar2 = &local_98.field_2;
        pcVar20 = (extraPath->_M_dataplus)._M_p;
        local_98._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar20,pcVar20 + extraPath->_M_string_length);
        if ((local_98._M_string_length != 0) &&
           (local_98._M_dataplus._M_p[local_98._M_string_length - 1] != '/')) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          std::__cxx11::string::append((char *)&local_50);
          std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        std::operator+(&local_50,&local_98,file);
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar8 = cmsys::SystemTools::FileExists(&local_98,true);
        if ((bVar8) && (bVar8 = cmsys::SystemTools::FileIsDirectory(&local_98), !bVar8)) {
          cmsys::SystemTools::CollapseFullPath((string *)&local_78,&local_98);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    ::operator[](this_02,extraPath);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](pmVar12,file);
          std::__cxx11::string::_M_assign((string *)pmVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar2) {
LAB_0033a90d:
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0033a59a;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar20 = (file->_M_dataplus)._M_p;
      p_Var17 = (_Base_ptr)file->_M_string_length;
      goto LAB_0033a58d;
    }
    cmsys::SystemTools::CollapseFullPath((string *)&local_78,file);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              ::operator[](this_02,extraPath);
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](pmVar12,file);
    std::__cxx11::string::_M_assign((string *)pmVar13);
  }
  else {
    in_RCX._M_p = (pointer)&local_68;
    pcVar20 = *(pointer *)(iVar11._M_node + 2);
    p_Var17 = iVar11._M_node[2]._M_parent;
LAB_0033a58d:
    local_78._M_allocated_capacity = (size_type)&local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar20,(pointer)((long)&p_Var17->_M_color + (long)pcVar20));
  }
LAB_0033a59a:
  __x = &(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header;
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                             *)(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&local_78,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX._M_p);
  if (((_Rb_tree_header *)iVar14._M_node != __x) &&
     (iVar9 = std::__cxx11::string::compare((string *)local_78._M_local_buf), -1 < iVar9)) {
    __s = *(cmDependInformation **)(iVar14._M_node + 2);
    goto LAB_0033a85d;
  }
  __s = (cmDependInformation *)operator_new(0xa0);
  p_Var7 = &(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header;
  memset(__s,0,0xa0);
  *(_Rb_tree_header **)((long)&(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x10) =
       p_Var7;
  *(_Rb_tree_header **)((long)&(__s->DependencySet)._M_t._M_impl.super__Rb_tree_header + 0x18) =
       p_Var7;
  (__s->FullPath)._M_dataplus._M_p = (pointer)&(__s->FullPath).field_2;
  (__s->PathOnly)._M_dataplus._M_p = (pointer)&(__s->PathOnly).field_2;
  (__s->IncludeName)._M_dataplus._M_p = (pointer)&(__s->IncludeName).field_2;
  std::__cxx11::string::_M_assign((string *)&__s->FullPath);
  cmsys::SystemTools::GetFilenamePath(&local_98,(string *)&local_78);
  std::__cxx11::string::operator=((string *)&__s->PathOnly,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)&__s->IncludeName);
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                             *)(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&local_78,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX._M_p);
  if ((_Rb_tree_header *)iVar14._M_node == __x) {
LAB_0033a6b5:
    this_01 = (cmDependInformation *)operator_new(0x48);
    __k = &(this_01->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (this_01->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)&this_01->DependDone;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__k,local_78._M_allocated_capacity,
               local_78._8_8_ + local_78._M_allocated_capacity);
    this_03 = &this->DependInformationMap;
    (this_01->FullPath)._M_dataplus._M_p = (pointer)0x0;
    if ((_Rb_tree_header *)iVar14._M_node == __x) {
      if (((this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
         (__ptr = (cmDependInformation *)__k,
         iVar9 = std::__cxx11::string::compare
                           ((string *)
                            ((this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_right + 1)), -1 < iVar9)) {
LAB_0033a7f2:
        __ptr = (cmDependInformation *)__k;
        pVar21 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                 ::_M_get_insert_unique_pos(&this_03->_M_t,(key_type *)__k);
      }
      else {
        p_Var18 = (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
        ;
LAB_0033a7aa:
        auVar4._8_8_ = 0;
        auVar4._0_8_ = p_Var18;
        pVar21 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar4 << 0x40);
      }
LAB_0033a7fa:
      iVar14._M_node = pVar21.first;
      if (pVar21.second == (_Rb_tree_node_base *)0x0) {
LAB_0033a840:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
        ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<(anonymous_namespace)::cmDependInformation,_std::default_delete<(anonymous_namespace)::cmDependInformation>_>_>_>_>
                        *)this_01,(_Link_type)__ptr);
        goto LAB_0033a84b;
      }
    }
    else {
      __ptr = (cmDependInformation *)(iVar14._M_node + 1);
      local_58 = this_03;
      iVar9 = std::__cxx11::string::compare((string *)__k);
      if (-1 < iVar9) {
        __ptr = (cmDependInformation *)__k;
        iVar9 = std::__cxx11::string::compare((string *)(iVar14._M_node + 1));
        if (iVar9 < 0) {
          p_Var18 = (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_right;
          if (p_Var18 == iVar14._M_node) goto LAB_0033a7aa;
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar14._M_node);
          pVar21.second = p_Var15;
          pVar21.first = p_Var15;
          __ptr = (cmDependInformation *)(p_Var15 + 1);
          iVar9 = std::__cxx11::string::compare((string *)__k);
          this_03 = local_58;
          if (-1 < iVar9) goto LAB_0033a7f2;
          if ((iVar14._M_node)->_M_right == (_Base_ptr)0x0) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = iVar14._M_node;
            pVar21 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar6 << 0x40);
            goto LAB_0033a805;
          }
          goto LAB_0033a7fa;
        }
        goto LAB_0033a840;
      }
      p_Var18 = (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pVar21.second = p_Var18;
      pVar21.first = p_Var18;
      if (p_Var18 == iVar14._M_node) goto LAB_0033a7fa;
      uVar16 = std::_Rb_tree_decrement(iVar14._M_node);
      __ptr = (cmDependInformation *)__k;
      iVar9 = std::__cxx11::string::compare((string *)(uVar16 + 0x20));
      this_03 = local_58;
      if (-1 < iVar9) goto LAB_0033a7f2;
      pVar21.second = iVar14._M_node;
      pVar21.first = iVar14._M_node;
      if (*(long *)(uVar16 + 0x18) != 0) goto LAB_0033a7fa;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar16;
      pVar21 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar5 << 0x40);
    }
LAB_0033a805:
    bVar8 = true;
    if ((__x != (_Rb_tree_header *)pVar21.second) && (pVar21.first == (_Rb_tree_node_base *)0x0)) {
      std::__cxx11::string::compare((string *)__k);
      bVar8 = (bool)(extraout_var >> 7);
    }
    __ptr = this_01;
    std::_Rb_tree_insert_and_rebalance
              (bVar8,(_Rb_tree_node_base *)this_01,pVar21.second,&__x->_M_header);
    psVar1 = &(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar1 = *psVar1 + 1;
    iVar14._M_node = (_Base_ptr)this_01;
  }
  else {
    __ptr = (cmDependInformation *)(iVar14._M_node + 1);
    iVar9 = std::__cxx11::string::compare((string *)local_78._M_local_buf);
    if (iVar9 < 0) goto LAB_0033a6b5;
  }
LAB_0033a84b:
  this_00 = (default_delete<(anonymous_namespace)::cmDependInformation> *)
            (((cmDependInformation *)iVar14._M_node)->FullPath)._M_dataplus._M_p;
  (((cmDependInformation *)iVar14._M_node)->FullPath)._M_dataplus._M_p = (pointer)__s;
  if (this_00 != (default_delete<(anonymous_namespace)::cmDependInformation> *)0x0) {
    std::default_delete<(anonymous_namespace)::cmDependInformation>::operator()(this_00,__ptr);
  }
LAB_0033a85d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  return __s;
}

Assistant:

cmDependInformation* GetDependInformation(const std::string& file,
                                            const std::string& extraPath)
  {
    // Get the full path for the file so that lookup is unambiguous.
    std::string fullPath = this->FullPath(file, extraPath);

    // Try to find the file's instance of cmDependInformation.
    auto result = this->DependInformationMap.find(fullPath);
    if (result != this->DependInformationMap.end()) {
      // Found an instance, return it.
      return result->second.get();
    }
    // Didn't find an instance.  Create a new one and save it.
    auto info = cm::make_unique<cmDependInformation>();
    auto* ptr = info.get();
    info->FullPath = fullPath;
    info->PathOnly = cmSystemTools::GetFilenamePath(fullPath);
    info->IncludeName = file;
    this->DependInformationMap[fullPath] = std::move(info);
    return ptr;
  }